

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_quaternion_op.hpp
# Opt level: O0

quaternion<double> * HAXX::operator*(quaternion<double> *__x,quaternion<double> *__y)

{
  double *in_RDX;
  undefined8 in_RSI;
  quaternion<double> *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  __m256d r;
  __m256d y;
  __m256d x;
  __m256d *in_stack_000000c8;
  __m256d *in_stack_000000d0;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double *local_80;
  undefined8 local_78;
  double *local_70;
  undefined8 local_68;
  
  local_88 = 0.0;
  local_90 = 0.0;
  local_98 = 0.0;
  local_a0 = 0.0;
  local_80 = in_RDX;
  local_78 = in_RSI;
  quaternion<double>::quaternion(in_RDI,&local_88,&local_90,&local_98,&local_a0);
  local_68 = local_78;
  local_70 = local_80;
  dVar1 = *local_80;
  dVar2 = local_80[1];
  dVar3 = local_80[2];
  dVar4 = local_80[3];
  MULDQ_NN(in_stack_000000d0,in_stack_000000c8);
  in_RDI->_M_real = dVar1;
  in_RDI->_M_imag_i = dVar2;
  in_RDI->_M_imag_j = dVar3;
  in_RDI->_M_imag_k = dVar4;
  return in_RDI;
}

Assistant:

inline quaternion<double> operator*(const quaternion<double>& __x,
    const quaternion<double>& __y) {
  
    quaternion<double> __r;
  
    // Load x,y into 256-bit vector lanes and perform the multiplication
    __m256d x = LOAD_256D_UNALIGNED_AS(double,&__x);
    __m256d y = LOAD_256D_UNALIGNED_AS(double,&__y);
    __m256d r = MULDQ_NN(x,y);
  
    STORE_256D_UNALIGNED_AS(double,&__r,r);
    
    return __r;
  }